

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O2

Maybe<kj::HttpMethod> kj::tryParseHttpMethod(StringPtr name)

{
  size_t in_RDX;
  NullableValue<kj::HttpMethod> NVar1;
  StringPtr name_00;
  Maybe<kj::OneOf<kj::HttpMethod,_kj::HttpConnectMethod>_> local_28;
  
  name_00.content.ptr = (char *)name.content.size_;
  NVar1 = (NullableValue<kj::HttpMethod>)name.content.ptr;
  name_00.content.size_ = in_RDX;
  tryParseHttpMethodAllowingConnect(&local_28,name_00);
  if ((local_28.ptr.isSet == true) && (local_28.ptr.field_1.value.tag != 2)) {
    if (local_28.ptr.field_1.value.tag != 1) {
      _::unreachable();
    }
    *(undefined1 *)NVar1 = 1;
    *(undefined4 *)((long)NVar1 + 4) = local_28.ptr.field_1._8_4_;
  }
  else {
    *(undefined1 *)NVar1 = 0;
  }
  return (Maybe<kj::HttpMethod>)NVar1;
}

Assistant:

kj::Maybe<HttpMethod> tryParseHttpMethod(kj::StringPtr name) {
  KJ_IF_SOME(method, tryParseHttpMethodAllowingConnect(name)) {
    KJ_SWITCH_ONEOF(method) {
      KJ_CASE_ONEOF(m, HttpMethod) { return m; }
      KJ_CASE_ONEOF(m, HttpConnectMethod) { return kj::none; }
    }
    KJ_UNREACHABLE;
  } else {
    return kj::none;
  }